

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_inner(lyd_node *parent,lys_module *module,char *name,ly_bool output,lyd_node **node)

{
  ly_ctx *plVar1;
  char *prefix;
  char *name_00;
  lys_module *parent_00;
  size_t prefix_len;
  size_t name_len;
  uint32_t options;
  lysc_node *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  LY_ERR ret__;
  ly_ctx *ctx;
  lysc_ext_instance *ext;
  lysc_node *schema;
  lyd_node *ret;
  lyd_node **pplStack_40;
  LY_ERR r;
  lyd_node **node_local;
  char *pcStack_30;
  ly_bool output_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  schema = (lysc_node *)0x0;
  ctx = (ly_ctx *)0x0;
  if (parent == (lyd_node *)0x0) {
    if (module == (lys_module *)0x0) {
      local_88 = (ly_ctx *)0x0;
    }
    else {
      local_88 = module->ctx;
    }
    local_80 = local_88;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      local_78 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_78 = parent->schema->module->ctx;
    }
    local_80 = local_78;
  }
  pplStack_40 = node;
  node_local._7_1_ = output;
  pcStack_30 = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if ((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) {
    ly_log(local_80,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || module",
           "lyd_new_inner");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((parent == (lyd_node *)0x0) && (node == (lyd_node **)0x0)) {
    ly_log(local_80,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || node",
           "lyd_new_inner");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(local_80,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_inner");
    parent_local._4_4_ = LY_EINVAL;
  }
  else {
    if (parent != (lyd_node *)0x0) {
      if (parent->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)parent[2].schema;
      }
      else {
        plVar1 = parent->schema->module->ctx;
      }
      if (((plVar1 != (ly_ctx *)0x0) && (module != (lys_module *)0x0)) &&
         (module->ctx != (ly_ctx *)0x0)) {
        if (parent == (lyd_node *)0x0) {
          local_98 = (ly_ctx *)0x0;
        }
        else {
          if (parent->schema == (lysc_node *)0x0) {
            local_90 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_90 = parent->schema->module->ctx;
          }
          local_98 = local_90;
        }
        if (module == (lys_module *)0x0) {
          local_a8 = (ly_ctx *)0x0;
        }
        else {
          local_a8 = module->ctx;
        }
        if (local_98 != local_a8) {
          if (parent == (lyd_node *)0x0) {
            local_b8 = (ly_ctx *)0x0;
          }
          else {
            if (parent->schema == (lysc_node *)0x0) {
              local_b0 = (ly_ctx *)parent[2].schema;
            }
            else {
              local_b0 = parent->schema->module->ctx;
            }
            local_b8 = local_b0;
          }
          ly_log(local_b8,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (module == (lys_module *)0x0) {
      name_local = (char *)parent->schema->module;
    }
    if (parent == (lyd_node *)0x0) {
      local_c0 = (lysc_node *)0x0;
    }
    else {
      local_c0 = parent->schema;
    }
    options = 0;
    if (output != '\0') {
      options = 0x10;
    }
    ext = (lysc_ext_instance *)
          lys_find_child(local_c0,(lys_module *)name_local,name,0,0x701,options);
    parent_00 = module_local;
    if (((lysc_node *)ext == (lysc_node *)0x0) && (module_local != (lys_module *)0x0)) {
      prefix = *(char **)(name_local + 8);
      prefix_len = strlen(*(char **)(name_local + 8));
      name_00 = pcStack_30;
      name_len = strlen(pcStack_30);
      ret._4_4_ = ly_nested_ext_schema
                            ((lyd_node *)parent_00,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,
                             (void *)0x0,name_00,name_len,(lysc_node **)&ext,
                             (lysc_ext_instance **)&ctx);
      if ((ret._4_4_ != LY_SUCCESS) && (ret._4_4_ != LY_ENOT)) {
        return ret._4_4_;
      }
    }
    if (ext == (lysc_ext_instance *)0x0) {
      ly_log(local_80,LY_LLERR,LY_EINVAL,
             "Inner node (container, notif, RPC, or action) \"%s\" not found.",pcStack_30);
      parent_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      parent_local._4_4_ = lyd_create_inner((lysc_node *)ext,(lyd_node **)&schema);
      if (parent_local._4_4_ == LY_SUCCESS) {
        if (ctx != (ly_ctx *)0x0) {
          *(uint *)schema->hash = *(uint *)schema->hash | 8;
        }
        if (module_local != (lys_module *)0x0) {
          lyd_insert_node((lyd_node *)module_local,(lyd_node **)0x0,(lyd_node *)schema,0);
        }
        if (pplStack_40 != (lyd_node **)0x0) {
          *pplStack_40 = (lyd_node *)schema;
        }
        parent_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_inner(struct lyd_node *parent, const struct lys_module *module, const char *name, ly_bool output,
        struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0,
            LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION, output ? LYS_GETNEXT_OUTPUT : 0);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Inner node (container, notif, RPC, or action) \"%s\" not found.",
            name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_inner(schema, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}